

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall GrcManager::CalculateCollisionOctaboxes(GrcManager *this,GrcFont *pfont)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int nAttrID;
  GrcSymbolTable *this_00;
  pointer pGVar2;
  bool fComplex;
  int iVar3;
  Symbol pGVar4;
  ulong uVar5;
  long lVar6;
  bool fShadow;
  bool fOverride;
  int n;
  GrpLineAndFile lnf;
  GdlExpression *pexp;
  int munitPR;
  int nPR;
  string local_70;
  string local_50;
  
  this_00 = this->m_psymtbl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"collision","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"complexFit","");
  GrcStructName::GrcStructName((GrcStructName *)&lnf,&local_50,&local_70);
  pGVar4 = GrcSymbolTable::FindSymbol(this_00,(GrcStructName *)&lnf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&lnf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  nAttrID = pGVar4->m_nInternalID;
  std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::resize
            (&this->m_vgbdy,(ulong)this->m_wGlyphIDLim);
  if (this->m_wGlyphIDLim != 0) {
    paVar1 = &lnf.m_staFile.field_2;
    lVar6 = 0;
    uVar5 = 0;
    do {
      lnf.m_nLinePre = -1;
      lnf.m_nLineOrig = -1;
      lnf.m_staFile._M_string_length = 0;
      lnf.m_staFile.field_2._M_local_buf[0] = '\0';
      lnf.m_staFile._M_dataplus._M_p = (pointer)paVar1;
      GrcGlyphAttrMatrix::Get
                (this->m_pgax,(gid16)uVar5,nAttrID,0,&pexp,&nPR,&munitPR,&fOverride,&fShadow,&lnf);
      if (pexp == (GdlExpression *)0x0) {
        fComplex = false;
      }
      else {
        iVar3 = (*pexp->_vptr_GdlExpression[7])(pexp,&n,0);
        fComplex = (bool)((byte)iVar3 & 0 < n);
      }
      pGVar2 = (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(gid16 *)((long)(pGVar2->m_gbcellEntire).m_dValues + lVar6 + -0x14) = (gid16)uVar5;
      GlyphBoundaries::OverlayGrid
                ((GlyphBoundaries *)((long)(pGVar2->m_gbcellEntire).m_dValues + lVar6 + -0x1c),pfont
                 ,fComplex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lnf.m_staFile._M_dataplus._M_p != paVar1) {
        operator_delete(lnf.m_staFile._M_dataplus._M_p,
                        CONCAT71(lnf.m_staFile.field_2._M_allocated_capacity._1_7_,
                                 lnf.m_staFile.field_2._M_local_buf[0]) + 1);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x680;
    } while (uVar5 < this->m_wGlyphIDLim);
  }
  return;
}

Assistant:

void GrcManager::CalculateCollisionOctaboxes(GrcFont * pfont)
{
	Symbol psymComplex = m_psymtbl->FindSymbol(GrcStructName("collision", "complexFit"));
	int nAttrIdComplex = psymComplex->InternalID();

	m_vgbdy.resize(m_wGlyphIDLim);
	for (utf16 wGid = 0; wGid < m_wGlyphIDLim; wGid++)
	{
		// The collision.complexFit attr tells whether the shape of this glyph is complex
		// enough to require a grid of octaboxes to represent its shape rather than a single
		// octabox.
		bool fComplex = false;
		GdlExpression * pexp;
		int nPR;
		int munitPR;
		bool fOverride, fShadow;
		GrpLineAndFile lnf;
		m_pgax->Get(wGid, nAttrIdComplex,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
		if (!pexp)
			fComplex = false;
		else
		{
			int n;
			if (!pexp->ResolveToInteger(&n, false))
				fComplex = false;
			else
				fComplex = (n > 0);
		}
		m_vgbdy[wGid].Initialize(wGid);
		m_vgbdy[wGid].OverlayGrid(pfont, fComplex);
	}
}